

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::BuiltinFunction::BuiltinFunction
          (BuiltinFunction *this,LocationRange *lr,string *name,Identifiers *params)

{
  string *in_RDX;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  *in_RSI;
  undefined8 *in_RDI;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *this_00;
  Fodder *in_stack_ffffffffffffffb8;
  ASTType in_stack_ffffffffffffffc4;
  LocationRange *location;
  AST *this_01;
  
  location = (LocationRange *)0x0;
  this_01 = (AST *)0x0;
  this_00 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)&stack0xffffffffffffffc8;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x2b5b6c);
  AST::AST(this_01,location,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(this_00);
  *in_RDI = &PTR__BuiltinFunction_003a43a0;
  std::__cxx11::string::string((string *)(in_RDI + 0x10),in_RDX);
  std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector(in_RSI,(vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                   *)in_RDX);
  return;
}

Assistant:

BuiltinFunction(const LocationRange &lr, const std::string &name, const Identifiers &params)
        : AST(lr, AST_BUILTIN_FUNCTION, Fodder{}), name(name), params(params)
    {
    }